

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuArch.c
# Opt level: O3

int x86cpuid_GetFirm(Cx86cpuid *p)

{
  long lVar1;
  UInt32 *pUVar2;
  
  pUVar2 = kVendors[0] + 2;
  lVar1 = 0;
  do {
    if ((((*(UInt32 (*) [3])(pUVar2 + -2))[0] == p->vendor[0]) && (pUVar2[-1] == p->vendor[1])) &&
       (*pUVar2 == p->vendor[2])) goto LAB_005cfc38;
    lVar1 = lVar1 + 1;
    pUVar2 = pUVar2 + 3;
  } while (lVar1 != 3);
  lVar1 = 0xffffffff;
LAB_005cfc38:
  return (int)lVar1;
}

Assistant:

int x86cpuid_GetFirm(const Cx86cpuid *p)
{
  unsigned i;
  for (i = 0; i < sizeof(kVendors) / sizeof(kVendors[i]); i++)
  {
    const UInt32 *v = kVendors[i];
    if (v[0] == p->vendor[0] &&
        v[1] == p->vendor[1] &&
        v[2] == p->vendor[2])
      return (int)i;
  }
  return -1;
}